

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str,char delimiter)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  long lVar4;
  iterator __first;
  iterator __last;
  reference pvVar5;
  bool bVar6;
  allocator local_201;
  string local_200;
  allocator local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198;
  string local_178;
  allocator<char> local_151;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  string local_140 [39];
  allocator<char> local_119;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  undefined1 local_108 [8];
  string value;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  string local_a0 [32];
  value_type local_80;
  long local_60;
  size_type end;
  char keyChar;
  bool embeddedQuote;
  anon_class_1_1_06a9eca7_for__M_pred find_ws;
  allocator local_41;
  string local_40 [8];
  string delims;
  char delimiter_local;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  
  delims.field_2._M_local_buf[0xf] = delimiter;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_40,"\'\"`",&local_41);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  end._3_1_ = delims.field_2._M_local_buf[0xf];
  trim(str);
  end._2_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  end._1_1_ = 0;
  end._0_1_ = ' ';
  while (bVar2 = ::std::__cxx11::string::empty(), ((bVar2 ^ 0xff) & 1) != 0) {
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str);
    lVar4 = ::std::__cxx11::string::find_first_of((char)local_40,(ulong)(uint)(int)*pcVar3);
    if (lVar4 == -1) {
      __first = ::std::begin<std::__cxx11::string>(str);
      __last = ::std::end<std::__cxx11::string>(str);
      local_c8 = ::std::
                 find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::split_up(std::__cxx11::string,char)::_lambda(char)_1_>
                           (__first._M_current,__last._M_current,end._3_1_);
      value.field_2._8_8_ = ::std::end<std::__cxx11::string>(str);
      bVar6 = __gnu_cxx::operator!=
                        (&local_c8,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)&value.field_2 + 8));
      if (bVar6) {
        local_110._M_current = (char *)::std::__cxx11::string::begin();
        local_118._M_current = local_c8._M_current;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  ((string *)local_108,local_110,local_118,&local_119);
        ::std::allocator<char>::~allocator(&local_119);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_108);
        local_148 = __gnu_cxx::
                    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator+(&local_c8,1);
        local_150._M_current = (char *)::std::__cxx11::string::end();
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  (local_140,local_148,local_150,&local_151);
        ::std::__cxx11::string::operator=((string *)str,local_140);
        ::std::__cxx11::string::~string(local_140);
        ::std::allocator<char>::~allocator(&local_151);
        ::std::__cxx11::string::~string((string *)local_108);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,str);
        ::std::__cxx11::string::operator=((string *)str,"");
      }
    }
    else {
      pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str);
      end._0_1_ = *pcVar3;
      local_60 = ::std::__cxx11::string::find_first_of((char)str,(ulong)(uint)(int)(char)end);
      while( true ) {
        bVar6 = false;
        if (local_60 != -1) {
          pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str);
          bVar6 = *pcVar3 == '\\';
        }
        if (!bVar6) break;
        local_60 = ::std::__cxx11::string::find_first_of((char)str,(ulong)(uint)(int)(char)end);
        end._1_1_ = 1;
      }
      if (local_60 == -1) {
        ::std::__cxx11::string::substr((ulong)&it,(ulong)str);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&it);
        ::std::__cxx11::string::~string((string *)&it);
        ::std::__cxx11::string::operator=((string *)str,"");
      }
      else {
        ::std::__cxx11::string::substr((ulong)&local_80,(ulong)str);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&local_80);
        ::std::__cxx11::string::~string((string *)&local_80);
        ::std::__cxx11::string::substr((ulong)local_a0,(ulong)str);
        ::std::__cxx11::string::operator=((string *)str,local_a0);
        ::std::__cxx11::string::~string(local_a0);
      }
    }
    if ((end._1_1_ & 1) != 0) {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(__return_storage_ptr__);
      ::std::__cxx11::string::string((string *)&local_198,(string *)pvVar5);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_1d8,"\\",&local_1d9);
      ::std::operator+(&local_1b8,&local_1d8,(char)end);
      cVar1 = (char)end;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_200,1,cVar1,&local_201);
      find_and_replace(&local_178,&local_198,&local_1b8,&local_200);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(__return_storage_ptr__);
      ::std::__cxx11::string::operator=((string *)pvVar5,(string *)&local_178);
      ::std::__cxx11::string::~string((string *)&local_178);
      ::std::__cxx11::string::~string((string *)&local_200);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_201);
      ::std::__cxx11::string::~string((string *)&local_1b8);
      ::std::__cxx11::string::~string((string *)&local_1d8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      ::std::__cxx11::string::~string((string *)&local_198);
      end._1_1_ = 0;
    }
    trim(str);
  }
  end._2_1_ = 1;
  ::std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> split_up(std::string str, char delimiter = '\0') {

    const std::string delims("\'\"`");
    auto find_ws = [delimiter](char ch) {
        return (delimiter == '\0') ? (std::isspace<char>(ch, std::locale()) != 0) : (ch == delimiter);
    };
    trim(str);

    std::vector<std::string> output;
    bool embeddedQuote = false;
    char keyChar = ' ';
    while(!str.empty()) {
        if(delims.find_first_of(str[0]) != std::string::npos) {
            keyChar = str[0];
            auto end = str.find_first_of(keyChar, 1);
            while((end != std::string::npos) && (str[end - 1] == '\\')) { // deal with escaped quotes
                end = str.find_first_of(keyChar, end + 1);
                embeddedQuote = true;
            }
            if(end != std::string::npos) {
                output.push_back(str.substr(1, end - 1));
                str = str.substr(end + 1);
            } else {
                output.push_back(str.substr(1));
                str = "";
            }
        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it + 1, str.end());
            } else {
                output.push_back(str);
                str = "";
            }
        }
        // transform any embedded quotes into the regular character
        if(embeddedQuote) {
            output.back() = find_and_replace(output.back(), std::string("\\") + keyChar, std::string(1, keyChar));
            embeddedQuote = false;
        }
        trim(str);
    }
    return output;
}